

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::addToSystemMenu
          (QMdiSubWindowPrivate *this,WindowStateAction action,QString *text,char *slot)

{
  QWidget *this_00;
  Data *pDVar1;
  QAction *pQVar2;
  Data *pDVar3;
  
  pDVar3 = (this->systemMenu).wp.d;
  if (pDVar3 != (Data *)0x0) {
    this_00 = (QWidget *)(this->systemMenu).wp.value;
    if (this_00 != (QWidget *)0x0 && *(int *)(pDVar3 + 4) != 0) {
      pDVar3 = (Data *)0x0;
      pQVar2 = QWidget::addAction(this_00,text,*(QObject **)&(this->super_QWidgetPrivate).field_0x8,
                                  slot,AutoConnection);
      if (pQVar2 != (QAction *)0x0) {
        pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar2);
      }
      pDVar1 = this->actions[action].wp.d;
      this->actions[action].wp.d = pDVar3;
      this->actions[action].wp.value = (QObject *)pQVar2;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }